

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

Gia_Man_t * Unr_ManUnrollFrame(Unr_Man_t *p,int f)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int *piVar17;
  uint uVar18;
  ulong uVar19;
  
  if (p->pGia->nRegs < p->pGia->vCis->nSize) {
    iVar8 = 0;
    do {
      pGVar1 = p->pFrames;
      p_00 = p->vPiLits;
      pGVar4 = Gia_ManAppendObj(pGVar1);
      uVar19 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar4 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar1->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = pGVar1->pObjs;
      if ((pGVar4 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar4)) {
LAB_005ba03d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pGVar1->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pGVar1->pObjs;
      if ((pGVar4 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar4)) goto LAB_005ba03d;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556);
      iVar8 = iVar8 + 1;
    } while (iVar8 < p->pGia->vCis->nSize - p->pGia->nRegs);
  }
  iVar8 = p->vObjLim->nSize;
  uVar9 = ~f + iVar8;
  uVar11 = 0;
  if (0 < (int)uVar9) {
    uVar11 = uVar9;
  }
  if (iVar8 <= (int)uVar11) {
LAB_005ba0d8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar19 = (ulong)p->vObjLim->pArray[uVar11];
  piVar13 = p->pObjs;
  piVar17 = p->pEnd;
  piVar5 = piVar13 + uVar19;
  if (piVar5 < piVar17) {
    do {
      iVar8 = (int)uVar19;
      if (iVar8 < 0) {
LAB_005ba01e:
        __assert_fail("h >= 0 && h < p->pEnd - p->pObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                      ,0x44,"Unr_Obj_t *Unr_ManObj(Unr_Man_t *, int)");
      }
      uVar16 = (long)piVar17 - (long)piVar13 >> 2;
      if ((long)uVar16 <= (long)(uVar19 & 0xffffffff)) goto LAB_005ba01e;
      piVar5 = piVar13 + (uVar19 & 0xffffffff);
      uVar19 = *(ulong *)(piVar5 + 2);
      uVar11 = (uint)uVar19;
      if ((uVar11 & 0xfffe0000) == 0xfffe0000 || (uVar19 & 0x1fffc) == 0x1fffc) {
        uVar9 = (uint)(uVar19 >> 0x20);
        if ((int)(uVar19 & 0x1fffc) == 0x1fffc || (uVar11 & 0xfffe0000) != 0xfffe0000) {
          if (((uVar19 & 0x100000000) == 0) || (f < piVar5[1])) {
            __assert_fail("pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                          ,0x194,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
          }
          uVar11 = (p->pGia->vCis->nSize - p->pGia->nRegs) * (f - piVar5[1]) + *piVar5;
          if (((int)uVar11 < 0) || (p->vPiLits->nSize <= (int)uVar11)) goto LAB_005ba0d8;
          iVar3 = p->vPiLits->pArray[uVar11];
          if (iVar3 < 0) {
LAB_005ba07b:
            __assert_fail("Value >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                          ,0x5f,"void Unr_ManObjSetValue(Unr_Obj_t *, int)");
          }
          uVar6 = (ulong)(ushort)(((uVar9 >> 0x11) + 1 & 0x7fff) % (uVar9 >> 2 & 0x7fff));
          uVar16 = uVar19 & 0x1ffffffffffff | uVar6 << 0x31;
          *(ulong *)(piVar5 + 2) = uVar16;
          piVar5[uVar6 + 5] = iVar3;
        }
        else {
          uVar6 = (ulong)*piVar5;
          if (((long)uVar6 < 0) || (uVar16 <= uVar6)) goto LAB_005ba01e;
          uVar12 = (uint)((ulong)*(undefined8 *)(piVar13 + uVar6 + 2) >> 0x20);
          uVar10 = uVar12 >> 2 & 0x7fff;
          uVar12 = uVar12 >> 0x11;
          if (uVar10 <= uVar12) goto LAB_005ba09a;
          uVar14 = (uint)(uVar19 >> 2) & 0x7fff;
          if (uVar10 <= uVar14) goto LAB_005ba0b9;
          if (piVar13[uVar6 + (long)((int)((uVar12 - uVar14) + uVar10) % (int)uVar10) + 5] < 0)
          goto LAB_005ba05c;
          uVar11 = piVar13[uVar6 + (long)((int)((uVar12 - uVar14) + uVar10) % (int)uVar10) + 5] ^
                   uVar11 & 1;
          uVar6 = (ulong)(ushort)(((uVar9 >> 0x11) + 1 & 0x7fff) % (uVar9 >> 2 & 0x7fff));
          uVar16 = uVar19 & 0x1ffffffffffff | uVar6 << 0x31;
          *(ulong *)(piVar5 + 2) = uVar16;
          piVar5[uVar6 + 5] = uVar11;
          if ((uVar19 >> 0x21 & 1) != 0) {
            Gia_ManAppendCo(p->pFrames,uVar11);
            uVar16 = *(ulong *)(piVar5 + 2);
          }
        }
      }
      else {
        uVar6 = (ulong)*piVar5;
        if (((long)uVar6 < 0) || (uVar16 <= uVar6)) goto LAB_005ba01e;
        uVar9 = (uint)((ulong)*(undefined8 *)(piVar13 + uVar6 + 2) >> 0x20);
        uVar12 = uVar9 >> 2 & 0x7fff;
        uVar9 = uVar9 >> 0x11;
        if (uVar12 <= uVar9) {
LAB_005ba09a:
          __assert_fail("pFanin->RankCur < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x4c,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        uVar10 = (uint)(uVar19 >> 2) & 0x7fff;
        if (uVar12 <= uVar10) {
LAB_005ba0b9:
          __assert_fail("pObj->uRDiff0 < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x4d,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        if (piVar13[uVar6 + (long)((int)((uVar9 - uVar10) + uVar12) % (int)uVar12) + 5] < 0) {
LAB_005ba05c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar7 = (ulong)piVar5[1];
        if (((long)uVar7 < 0) || (uVar16 <= uVar7)) goto LAB_005ba01e;
        uVar14 = (uint)((ulong)*(undefined8 *)(piVar13 + uVar7 + 2) >> 0x20);
        uVar15 = uVar14 >> 2 & 0x7fff;
        uVar14 = uVar14 >> 0x11;
        if (uVar15 <= uVar14) {
          __assert_fail("pFanin->RankCur < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x54,"int Unr_ManFanin1Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        uVar18 = (uint)(uVar19 >> 0x11) & 0x7fff;
        if (uVar15 <= uVar18) {
          __assert_fail("pObj->uRDiff1 < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x55,"int Unr_ManFanin1Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        if (piVar13[uVar7 + (long)((int)((uVar14 - uVar18) + uVar15) % (int)uVar15) + 5] < 0)
        goto LAB_005ba05c;
        iVar3 = Gia_ManHashAnd(p->pFrames,
                               piVar13[uVar6 + (long)((int)((uVar9 - uVar10) + uVar12) % (int)uVar12
                                                     ) + 5] ^ uVar11 & 1,
                               piVar13[uVar7 + (long)((int)((uVar14 - uVar18) + uVar15) %
                                                     (int)uVar15) + 5] ^ uVar11 >> 1 & 1);
        if (iVar3 < 0) goto LAB_005ba07b;
        uVar11 = (uint)(*(ulong *)(piVar5 + 2) >> 0x20);
        uVar19 = (ulong)(ushort)(((uVar11 >> 0x11) + 1 & 0x7fff) % (uVar11 >> 2 & 0x7fff));
        uVar16 = *(ulong *)(piVar5 + 2) & 0x1ffffffffffff | uVar19 << 0x31;
        *(ulong *)(piVar5 + 2) = uVar16;
        piVar5[uVar19 + 5] = iVar3;
      }
      uVar11 = (uint)(uVar16 >> 0x22) & 0x7ffe;
      uVar19 = (ulong)(iVar8 + uVar11 + 6);
      piVar13 = p->pObjs;
      piVar17 = p->pEnd;
      piVar5 = piVar13 + (ulong)(iVar8 + uVar11) + 6;
    } while (piVar5 < piVar17);
  }
  if (piVar5 != piVar17) {
    __assert_fail("p->pObjs + hStart == p->pEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0x19a,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  pGVar1 = p->pFrames;
  if (pGVar1->vCos->nSize - pGVar1->nRegs != (p->pGia->vCos->nSize - p->pGia->nRegs) * (f + 1)) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0x19b,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Unr_ManUnrollFrame( Unr_Man_t * p, int f )
{
    int i, iLit, iLit0, iLit1, hStart;
    for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
        Vec_IntPush( p->vPiLits, Gia_ManAppendCi(p->pFrames) );
    hStart = Vec_IntEntry( p->vObjLim, Abc_MaxInt(0, Vec_IntSize(p->vObjLim)-1-f) );
    while ( p->pObjs + hStart < p->pEnd )
    {
        Unr_Obj_t * pUnrObj = Unr_ManObj( p, hStart );
        if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 != UNR_DIFF_NULL ) // AND node
        {
            iLit0 = Unr_ManFanin0Value( p, pUnrObj );
            iLit1 = Unr_ManFanin1Value( p, pUnrObj );
            iLit  = Gia_ManHashAnd( p->pFrames, iLit0, iLit1 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        else if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 == UNR_DIFF_NULL ) // PO/RI/RO
        {
            iLit  = Unr_ManFanin0Value( p, pUnrObj );
            Unr_ManObjSetValue( pUnrObj, iLit );
            if ( pUnrObj->fItIsPo )
                Gia_ManAppendCo( p->pFrames, iLit );
        }
        else // PI  (pUnrObj->hFan0 is CioId; pUnrObj->hFan1 is tent)
        {
            assert( pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1 );
            iLit = Vec_IntEntry( p->vPiLits, Gia_ManPiNum(p->pGia) * (f - pUnrObj->hFan1) + pUnrObj->hFan0 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        hStart += Unr_ObjSize( pUnrObj );
    }
    assert( p->pObjs + hStart == p->pEnd );
    assert( Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia) );
    return p->pFrames;
}